

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O1

bool GenerateFineGeometryCuttingPlane
               (vector3 *start_vertex,vector3 *end_vertex,double half_offset_distance,
               double *param_4,double last_half_offset_distance,double *last_local_layer_height,
               double *cylinder_height,bool has_cutting_plane,CuttingPlane *cutting_plane,
               fstream *out)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  ostream *os;
  undefined3 in_register_00000089;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double distance_tolerance;
  vector3 initial_box_left_corner;
  vector3 initial_box_right_corner;
  vector3 target_center_point;
  vector3 rotate_vector;
  vector3 local_118;
  double local_100;
  double local_f8;
  undefined8 uStack_f0;
  vector3 local_e0;
  vector3 local_c8;
  vector3 local_b0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  vector3 local_60;
  vector3 local_48;
  
  local_100 = 1.5;
  if (CONCAT31(in_register_00000089,has_cutting_plane) == 0) {
    bVar3 = false;
  }
  else {
    bVar4 = CuttingPlane::DeviationFromPlane(cutting_plane,start_vertex,end_vertex,&local_100);
    bVar3 = true;
    if (bVar4) {
      dVar1 = (cutting_plane->uniform_normal).x;
      dVar6 = (cutting_plane->uniform_normal).y;
      dVar9 = (cutting_plane->uniform_normal).z;
      dVar15 = (start_vertex->z * dVar9 + start_vertex->x * dVar1 + start_vertex->y * dVar6) -
               cutting_plane->start_distance;
      bVar3 = false;
      if (0.0 < dVar15) {
        return false;
      }
      if (dVar15 * ((dVar9 * end_vertex->z + dVar1 * end_vertex->x + dVar6 * end_vertex->y) -
                   cutting_plane->start_distance) <= 0.0) {
        return false;
      }
    }
  }
  dVar6 = end_vertex->x - start_vertex->x;
  dVar9 = end_vertex->y - start_vertex->y;
  dVar1 = dVar9 * dVar9 + dVar6 * dVar6;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  local_78 = (dVar9 / dVar1) * half_offset_distance;
  local_88 = (-dVar6 / dVar1) * half_offset_distance;
  local_98 = (0.0 / dVar1) * half_offset_distance;
  dVar22 = start_vertex->x + local_78;
  dVar23 = start_vertex->y + local_88;
  dVar15 = end_vertex->x;
  dVar2 = end_vertex->y;
  local_78 = local_78 + dVar15;
  local_88 = local_88 + dVar2;
  dVar10 = -(dVar9 / dVar1) * half_offset_distance;
  dVar16 = -(-dVar6 / dVar1) * half_offset_distance;
  dVar17 = -(0.0 / dVar1) * half_offset_distance;
  uStack_70 = 0;
  dVar7 = local_78 - dVar22;
  uStack_80 = 0x8000000000000000;
  dVar6 = local_88 - dVar23;
  local_f8 = local_98 + start_vertex->z;
  dVar1 = end_vertex->z;
  local_98 = local_98 + dVar1;
  uStack_90 = 0;
  uStack_f0 = 0;
  dVar21 = local_98 - local_f8;
  dVar9 = dVar21 * dVar21 + dVar7 * dVar7 + dVar6 * dVar6;
  dVar18 = start_vertex->x + dVar10;
  dVar19 = start_vertex->y + dVar16;
  dVar20 = start_vertex->z + dVar17;
  dVar11 = *param_4 * 0.5;
  dVar12 = *last_local_layer_height * 0.5;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar8 = dVar18 - dVar22;
  dVar13 = dVar19 - dVar23;
  dVar14 = dVar20 - local_f8;
  dVar14 = dVar14 * dVar14 + dVar8 * dVar8 + dVar13 * dVar13;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  local_48.x = dVar7;
  local_48.y = dVar6;
  local_48.z = dVar21;
  dVar7 = vector3::GetZAngle(&local_48);
  local_b0.x = (start_vertex->x + end_vertex->x) * 0.5;
  local_b0.y = (start_vertex->y + end_vertex->y) * 0.5;
  local_b0.z = (start_vertex->z + end_vertex->z) * 0.5;
  local_c8.x = dVar9 * 0.5;
  dVar21 = dVar14 * 0.5;
  local_c8.z = 0.0;
  local_e0.x = dVar9 * -0.5;
  local_e0.y = dVar14 * -0.5;
  dVar6 = *param_4;
  local_e0.z = -dVar6;
  if ((((*last_local_layer_height != 0.0) || (NAN(*last_local_layer_height))) || (dVar6 != 0.0)) ||
     (NAN(dVar6))) {
    dVar9 = start_vertex->x - end_vertex->x;
    dVar14 = start_vertex->y - end_vertex->y;
    dVar6 = start_vertex->z - end_vertex->z;
    dVar6 = dVar6 * dVar6 + dVar9 * dVar9 + dVar14 * dVar14;
    local_c8.y = dVar21;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(out + 0x10),"intersection{\n",0xe);
        operator<<((ostream *)(out + 0x10),cutting_plane);
      }
      os = (ostream *)(out + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(os,"union{\n",7);
      std::__ostream_insert<char,std::char_traits<char>>(os,"cone\n{ ",7);
      local_118.z = local_f8 - dVar12;
      local_118.x = dVar22;
      local_118.y = dVar23;
      operator<<(os,&local_118);
      std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
      poVar5 = std::ostream::_M_insert<double>(dVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      local_60.z = local_98 - dVar11;
      local_60.x = local_78;
      local_60.y = local_88;
      operator<<(poVar5,&local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = std::ostream::_M_insert<double>(dVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n}\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(os,"cone\n{ ",7);
      local_118.z = dVar20 - dVar12;
      local_118.x = dVar18;
      local_118.y = dVar19;
      operator<<(os,&local_118);
      std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
      poVar5 = std::ostream::_M_insert<double>(dVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      local_60.z = (dVar17 + dVar1) - dVar11;
      local_60.x = dVar10 + dVar15;
      local_60.y = dVar16 + dVar2;
      operator<<(poVar5,&local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = std::ostream::_M_insert<double>(dVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n}\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(os,"box\n{",5);
      operator<<(os,&local_e0);
      std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
      operator<<(os,&local_c8);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\nrotate z*",10);
      poVar5 = std::ostream::_M_insert<double>(dVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\ntranslate ",0xb);
      operator<<(poVar5,&local_b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n}\n",3);
      if ((*last_local_layer_height != 0.0) || (NAN(*last_local_layer_height))) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"torus\n{",7);
        poVar5 = std::ostream::_M_insert<double>(dVar21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::ostream::_M_insert<double>(dVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nrotate x*90 \ntranslate ",0x18)
        ;
        local_118.x = start_vertex->x;
        local_118.y = start_vertex->y;
        local_118.z = start_vertex->z - dVar12;
        operator<<(poVar5,&local_118);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n}\n",3);
        dVar6 = start_vertex->x - start_vertex->x;
        dVar9 = start_vertex->y - start_vertex->y;
        dVar1 = start_vertex->z - (start_vertex->z - *last_local_layer_height);
        dVar1 = dVar1 * dVar1 + dVar6 * dVar6 + dVar9 * dVar9;
        if (dVar1 < 0.0) {
          dVar1 = sqrt(dVar1);
        }
        else {
          dVar1 = SQRT(dVar1);
        }
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"cylinder\n{",10);
          local_118.z = start_vertex->z - *last_local_layer_height;
          local_118.x = start_vertex->x;
          local_118.y = start_vertex->y;
          operator<<(os,&local_118);
          std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          operator<<(os,start_vertex);
          std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
          poVar5 = std::ostream::_M_insert<double>(dVar21);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n}\n",3);
        }
      }
      if ((*param_4 != 0.0) || (NAN(*param_4))) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"torus\n{",7);
        poVar5 = std::ostream::_M_insert<double>(dVar21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::ostream::_M_insert<double>(dVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nrotate x*90 \ntranslate ",0x18)
        ;
        local_118.x = end_vertex->x;
        local_118.y = end_vertex->y;
        local_118.z = end_vertex->z - dVar11;
        operator<<(poVar5,&local_118);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n}\n",3);
        dVar6 = end_vertex->x - end_vertex->x;
        dVar9 = end_vertex->y - end_vertex->y;
        dVar1 = end_vertex->z - (end_vertex->z - *param_4);
        dVar1 = dVar1 * dVar1 + dVar6 * dVar6 + dVar9 * dVar9;
        if (dVar1 < 0.0) {
          dVar1 = sqrt(dVar1);
        }
        else {
          dVar1 = SQRT(dVar1);
        }
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"cylinder\n{",10);
          local_118.z = end_vertex->z - *param_4;
          local_118.x = end_vertex->x;
          local_118.y = end_vertex->y;
          operator<<(os,&local_118);
          std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          operator<<(os,end_vertex);
          std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
          poVar5 = std::ostream::_M_insert<double>(dVar21);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n}\n",3);
        }
      }
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"texture{ GcodeTexture }\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
      return true;
    }
  }
  return false;
}

Assistant:

bool GenerateFineGeometryCuttingPlane(vector3 &start_vertex, vector3 &end_vertex, double half_offset_distance, const double &local_layer_height, double last_half_offset_distance, const double &last_local_layer_height, const double &cylinder_height, bool has_cutting_plane, CuttingPlane &cutting_plane, fstream &out)
{
  bool need_to_cut = false;
  double distance_tolerance = NOZZLE_DIAMETER;

  bool not_null = false;

  if (!has_cutting_plane)
  {
    need_to_cut = false;
  }
  else
  {
    if (cutting_plane.DeviationFromPlane(start_vertex, end_vertex, distance_tolerance))
    {
      if (cutting_plane.OnPlanePositive(start_vertex, end_vertex))
      {
        need_to_cut = false;
      }
      else
      {
        return not_null;
      }
    }
    else
    {
      need_to_cut = true;
    }
  }

  vector3 left_start, left_end, right_start, right_end;
  vector3 link_vertex = end_vertex - start_vertex;
  vector3 offset_vertex(link_vertex.y, -link_vertex.x, 0);
  offset_vertex.Uniform();

  left_start = start_vertex + offset_vertex * half_offset_distance;
  left_end = end_vertex + offset_vertex * half_offset_distance;

  offset_vertex.Reverse();
  right_start = start_vertex + offset_vertex * half_offset_distance;
  right_end = end_vertex + offset_vertex * half_offset_distance;

  //vector3 local_x_axis, local_y_axis;
  //local_x_axis = left_end - left_start;
  //local_y_axis = right_start - left_start;
  //local_x_axis.Uniform();
  //local_y_axis.Uniform();
  //vector3 local_origin = left_start.MoveDownRadius(local_layer_height);
  //vector3 corner_link = right_end - local_origin;
  //double local_x_coordinate = corner_link * local_x_axis;
  //double local_y_coordinate = corner_link * local_y_axis;
  double cone_bottom_radius = local_layer_height / 2;
  double cone_top_radius = last_local_layer_height / 2;
  //vector3 box_corner_vertex(local_x_coordinate, local_y_coordinate, local_layer_height);


  double x_length = (left_end - left_start).Length();
  double y_length = (right_start - left_start).Length();
  vector3 rotate_vector = left_end - left_start;
  //   double x_angle = rotate_vector.GetXAngle();
  //   double y_angle = rotate_vector.GetYAngle();
  double z_angle = rotate_vector.GetZAngle();
  vector3 target_center_point = (start_vertex + end_vertex) * 0.5;
  vector3 initial_box_right_corner(x_length / 2, y_length / 2, 0);
  vector3 initial_box_left_corner(-x_length / 2, -y_length / 2, -local_layer_height);

  if (last_local_layer_height == 0 && local_layer_height == 0)
  {
    return not_null;
  }

  if ((start_vertex - end_vertex).Length() == 0)
  {
    return not_null;
  }

  not_null = true;

  if (need_to_cut)
  {
    out << "intersection{\n";
    out << cutting_plane;
  }

  out << "union{\n";

  out << "cone\n\
{ " << left_start.MoveDownRadius(cone_top_radius) << "," << cone_top_radius << "\n" << left_end.MoveDownRadius(cone_bottom_radius) << "," << cone_bottom_radius << "\n\
}\n";

  out << "cone\n\
{ " << right_start.MoveDownRadius(cone_top_radius) << "," << cone_top_radius << "\n" << right_end.MoveDownRadius(cone_bottom_radius) << "," << cone_bottom_radius << "\n\
}\n";

  out << "box\n\
{" << initial_box_left_corner << "," << initial_box_right_corner << "\n\
rotate z*" << z_angle << "\n\
translate " << target_center_point << "\n\
}\n";

  if (last_local_layer_height != 0)
  {
    out << "torus\n\
{" << y_length / 2 << ", " << cone_top_radius << "\n\
rotate x*90 \n\
translate " << (start_vertex).MoveDownRadius(cone_top_radius) << "\n\
}\n";

    vector3 temp = (start_vertex).MoveDownRadius(last_local_layer_height);
    if ((start_vertex - temp).Length() != 0)
    {
      out << "cylinder\n\
{" << (start_vertex).MoveDownRadius(last_local_layer_height) << ", " << (start_vertex) << "," << y_length / 2 << "\n\
}\n";
    }
  }

  if (local_layer_height != 0)
  {
    out << "torus\n\
{" << y_length / 2 << ", " << cone_bottom_radius << "\n\
rotate x*90 \n\
translate " << (end_vertex).MoveDownRadius(cone_bottom_radius) << "\n\
}\n";

    vector3 temp = (end_vertex).MoveDownRadius(local_layer_height);
    if ((end_vertex - temp).Length() != 0)
    {
      out << "cylinder\n\
{" << (end_vertex).MoveDownRadius(local_layer_height) << ", " << (end_vertex) << "," << y_length / 2 << "\n\
}\n";
    }
  }

  if (need_to_cut)
  {
    out << "}\n";
  }

  out << "texture{ GcodeTexture }\n";
  out << "}\n";

  return not_null;
}